

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate.cpp
# Opt level: O3

Aggregate * __thiscall hta::Aggregate::operator+=(Aggregate *this,Aggregate other)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = -(ulong)(this->minimum < other.minimum);
  uVar2 = -(ulong)(other.maximum < this->maximum);
  this->minimum = (Value)(~uVar1 & (ulong)other.minimum | (ulong)this->minimum & uVar1);
  this->maximum = (Value)(~uVar2 & (ulong)other.maximum | (ulong)this->maximum & uVar2);
  this->sum = other.sum + this->sum;
  this->count = this->count + other.count;
  this->integral = other.integral + this->integral;
  (this->active_time).__r = (this->active_time).__r + other.active_time.__r;
  return this;
}

Assistant:

Aggregate& Aggregate::operator+=(Aggregate other)
{
    minimum = std::min(other.minimum, minimum);
    maximum = std::max(other.maximum, maximum);
    sum += other.sum;
    count += other.count;
    integral += other.integral;
    active_time += other.active_time;
    return *this;
}